

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

ostream * pstore::operator<<(ostream *os,address *addr)

{
  segment_type sVar1;
  offset_type oVar2;
  ostream *poVar3;
  address *addr_local;
  ostream *os_local;
  
  poVar3 = std::operator<<(os,"{s:");
  sVar1 = address::segment(addr);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
  poVar3 = std::operator<<(poVar3," +:");
  oVar2 = address::offset(addr);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,oVar2);
  poVar3 = std::operator<<(poVar3,"}");
  return poVar3;
}

Assistant:

std::ostream & operator<< (std::ostream & os, address const & addr) {
        return os << "{s:" << addr.segment () << " +:" << addr.offset () << "}";
    }